

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testInit
          (UniformBlockLayoutQualifierConflictTest *this)

{
  pointer *pptVar1;
  iterator __position;
  testCase tVar2;
  GLuint qualifier;
  QUALIFIERS QVar3;
  GLuint stage;
  STAGES SVar4;
  testCase test_case;
  testCase local_30;
  
  QVar3 = DEFAULT;
  do {
    SVar4 = COMPUTE;
    do {
      __position._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_30.m_qualifier = QVar3;
        local_30.m_stage = SVar4;
        std::
        vector<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase>>
        ::
        _M_realloc_insert<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase_const&>
                  ((vector<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase>>
                    *)&this->m_test_cases,__position,&local_30);
      }
      else {
        tVar2.m_stage = SVar4;
        tVar2.m_qualifier = QVar3;
        *__position._M_current = tVar2;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      SVar4 = SVar4 + VERTEX;
    } while (SVar4 != STAGE_MAX);
    QVar3 = QVar3 + STD140;
  } while (QVar3 != QUALIFIERS_MAX);
  return;
}

Assistant:

void UniformBlockLayoutQualifierConflictTest::testInit()
{
	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}